

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

Matrix * rlGetMatrixModelview(void)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Matrix *in_RDI;
  
  in_RDI->m0 = 0.0;
  in_RDI->m4 = 0.0;
  in_RDI->m8 = 0.0;
  in_RDI->m12 = 0.0;
  in_RDI->m1 = 0.0;
  in_RDI->m5 = 0.0;
  in_RDI->m9 = 0.0;
  in_RDI->m13 = 0.0;
  in_RDI->m2 = 0.0;
  in_RDI->m6 = 0.0;
  in_RDI->m10 = 0.0;
  in_RDI->m14 = 0.0;
  in_RDI->m3 = 0.0;
  in_RDI->m7 = 0.0;
  in_RDI->m11 = 0.0;
  in_RDI->m15 = 0.0;
  in_RDI->m0 = 1.0;
  in_RDI->m5 = 1.0;
  in_RDI->m10 = 1.0;
  in_RDI->m15 = 1.0;
  uVar2 = RLGL.State.modelview._24_8_;
  fVar1 = RLGL.State.modelview.m5;
  in_RDI->m1 = RLGL.State.modelview.m1;
  uVar3 = RLGL.State.modelview._24_8_;
  in_RDI->m5 = fVar1;
  RLGL.State.modelview.m9 = (float)uVar2;
  RLGL.State.modelview.m13 = SUB84(uVar2,4);
  fVar1 = RLGL.State.modelview.m13;
  in_RDI->m9 = RLGL.State.modelview.m9;
  RLGL.State.modelview._24_8_ = uVar3;
  uVar2 = RLGL.State.modelview._40_8_;
  in_RDI->m13 = fVar1;
  fVar1 = RLGL.State.modelview.m6;
  in_RDI->m2 = RLGL.State.modelview.m2;
  uVar3 = RLGL.State.modelview._40_8_;
  in_RDI->m6 = fVar1;
  RLGL.State.modelview.m10 = (float)uVar2;
  RLGL.State.modelview.m14 = SUB84(uVar2,4);
  fVar1 = RLGL.State.modelview.m14;
  in_RDI->m10 = RLGL.State.modelview.m10;
  RLGL.State.modelview._40_8_ = uVar3;
  uVar2 = RLGL.State.modelview._56_8_;
  in_RDI->m14 = fVar1;
  fVar1 = RLGL.State.modelview.m7;
  in_RDI->m3 = RLGL.State.modelview.m3;
  uVar3 = RLGL.State.modelview._56_8_;
  in_RDI->m7 = fVar1;
  RLGL.State.modelview.m11 = (float)uVar2;
  RLGL.State.modelview.m15 = SUB84(uVar2,4);
  fVar1 = RLGL.State.modelview.m15;
  in_RDI->m11 = RLGL.State.modelview.m11;
  RLGL.State.modelview._56_8_ = uVar3;
  uVar2 = RLGL.State.modelview._8_8_;
  in_RDI->m15 = fVar1;
  fVar1 = RLGL.State.modelview.m4;
  in_RDI->m0 = RLGL.State.modelview.m0;
  uVar3 = RLGL.State.modelview._8_8_;
  in_RDI->m4 = fVar1;
  RLGL.State.modelview.m8 = (float)uVar2;
  RLGL.State.modelview.m12 = SUB84(uVar2,4);
  fVar1 = RLGL.State.modelview.m12;
  in_RDI->m8 = RLGL.State.modelview.m8;
  RLGL.State.modelview._8_8_ = uVar3;
  in_RDI->m12 = fVar1;
  return in_RDI;
}

Assistant:

Matrix rlGetMatrixModelview(void)
{
    Matrix matrix = MatrixIdentity();
#if defined(GRAPHICS_API_OPENGL_11)
    float mat[16];
    glGetFloatv(GL_MODELVIEW_MATRIX, mat);
    matrix.m0  = mat[0];     matrix.m1  = mat[1];     matrix.m2  = mat[2];     matrix.m3  = mat[3];
    matrix.m4  = mat[4];     matrix.m5  = mat[5];     matrix.m6  = mat[6];     matrix.m7  = mat[7];
    matrix.m8  = mat[8];     matrix.m9  = mat[9];     matrix.m10 = mat[10];    matrix.m11 = mat[11];
    matrix.m12 = mat[12];    matrix.m13 = mat[13];    matrix.m14 = mat[14];    matrix.m15 = mat[15];
#else
    matrix = RLGL.State.modelview;
#endif
    return matrix;
}